

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall higan::Timer::~Timer(Timer *this)

{
  std::_Function_base::~_Function_base(&(this->timer_callback_).super__Function_base);
  TimeStamp::~TimeStamp(&this->expire_time_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Timer::~Timer()
{

}